

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::buildComponentIdMap
          (ValidatorImpl *this,ComponentPtr *component,IdMap *idMap,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reportedConnections)

{
  shared_ptr<libcellml::ParentedEntity_const> *this_00;
  IssueImpl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  byte bVar3;
  bool bVar4;
  element_type *peVar5;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  ulong uVar8;
  size_type sVar9;
  element_type *peVar10;
  element_type *peVar11;
  Entity *pEVar12;
  element_type *peVar13;
  element_type *peVar14;
  size_t sVar15;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  byte local_1369;
  ComponentEntity local_1230;
  ulong local_1220;
  size_t c;
  string local_11f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  string local_1198;
  string local_1178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  undefined1 local_10d8 [8];
  IssuePtr issue_2;
  string local_10a8;
  ImportedEntity local_1088;
  string local_1078;
  string local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  byte local_ff2;
  byte local_ff1;
  ImportedEntity local_ff0;
  string local_fe0;
  ImportedEntity local_fc0;
  string local_fb0;
  string local_f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  string local_a90;
  undefined1 local_a70 [8];
  ResetPtr item_1;
  size_t i_1;
  _Base_ptr local_a38;
  undefined1 local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  undefined1 local_9a8 [8];
  IssuePtr issue_1;
  string local_978;
  string local_958;
  string local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  undefined1 local_838 [8];
  string connectionDescription;
  string local_810;
  byte local_7e9;
  string local_7e8;
  byte local_7c1;
  string local_7c0;
  byte local_799;
  string local_798;
  string local_778;
  string local_758;
  undefined1 local_738 [8];
  string connection;
  string connectionId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  undefined1 local_658 [8];
  IssuePtr issue;
  string local_628;
  string local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [8];
  string mappingDescription;
  string mappingId;
  string local_488;
  undefined1 local_468 [8];
  string s2;
  string local_428;
  undefined1 local_408 [8];
  string s1;
  undefined1 local_3d8 [8];
  ComponentPtr equivParent;
  VariablePtr equiv;
  size_t e;
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  undefined1 local_2b0 [8];
  VariablePtr item;
  size_t i;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  shared_ptr<const_libcellml::ParentedEntity> local_1d8;
  shared_ptr<libcellml::Model> local_1c8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  shared_ptr<const_libcellml::ParentedEntity> local_158;
  shared_ptr<libcellml::Component> local_148;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  shared_ptr<const_libcellml::ParentedEntity> local_d8;
  shared_ptr<libcellml::Component> local_c8;
  undefined1 local_b8 [8];
  string owning;
  string imported;
  string local_68;
  undefined1 local_48 [8];
  string info;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *reportedConnections_local;
  IdMap *idMap_local;
  ComponentPtr *component_local;
  ValidatorImpl *this_local;
  
  info.field_2._8_8_ = reportedConnections;
  std::__cxx11::string::string((string *)local_48);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  Entity::id_abi_cxx11_(&local_68,(Entity *)peVar5);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_68);
  if (((bVar3 ^ 0xff) & 1) != 0) {
    std::__cxx11::string::string((string *)(owning.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_b8);
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    bVar4 = ImportedEntity::isImport(&peVar5->super_ImportedEntity);
    if (bVar4) {
      std::__cxx11::string::operator=((string *)(owning.field_2._M_local_buf + 8),"imported ");
    }
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)&local_d8,component);
    owningComponent((libcellml *)&local_c8,(ParentedEntityConstPtr *)&local_d8);
    bVar4 = std::operator!=(&local_c8,(nullptr_t)0x0);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c8);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_d8);
    if (bVar4) {
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_158,component);
      owningComponent((libcellml *)&local_148,(ParentedEntityConstPtr *)&local_158);
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_148);
      NamedEntity::name_abi_cxx11_(&local_138,(NamedEntity *)peVar5);
      std::operator+(&local_118,"\' in component \'",&local_138);
      std::operator+(&local_f8,&local_118,"\'");
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::shared_ptr<libcellml::Component>::~shared_ptr(&local_148);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_158);
    }
    else {
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_1d8,component);
      owningModel((libcellml *)&local_1c8,(ParentedEntityConstPtr *)&local_1d8);
      this_01 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_1c8);
      NamedEntity::name_abi_cxx11_(&local_1b8,(NamedEntity *)this_01);
      std::operator+(&local_198,"\' in model \'",&local_1b8);
      std::operator+(&local_178,&local_198,"\'");
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::shared_ptr<libcellml::Model>::~shared_ptr(&local_1c8);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_1d8);
    }
    std::operator+(&local_258," - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&owning.field_2 + 8));
    std::operator+(&local_238,&local_258,"component \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    NamedEntity::name_abi_cxx11_(&local_278,(NamedEntity *)peVar5);
    std::operator+(&local_218,&local_238,&local_278);
    std::operator+(&local_1f8,&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    Entity::id_abi_cxx11_((string *)&i,(Entity *)peVar5);
    addIdMapItem(this,(string *)&i,(string *)local_48,idMap);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)(owning.field_2._M_local_buf + 8));
  }
  item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var2._M_pi = item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::variableCount(peVar5);
    if (p_Var6 <= _Var2._M_pi) break;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    Component::variable((Component *)local_2b0,(size_t)peVar5);
    peVar7 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2b0);
    Entity::id_abi_cxx11_(&local_2d0,(Entity *)peVar7);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_2d0);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      peVar7 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2b0);
      NamedEntity::name_abi_cxx11_(&local_370,&peVar7->super_NamedEntity);
      std::operator+(&local_350," - variable \'",&local_370);
      std::operator+(&local_330,&local_350,"\' in component \'");
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_390,(NamedEntity *)peVar5);
      std::operator+(&local_310,&local_330,&local_390);
      std::operator+(&local_2f0,&local_310,"\'");
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      peVar7 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2b0);
      Entity::id_abi_cxx11_((string *)&e,(Entity *)peVar7);
      addIdMapItem(this,(string *)&e,(string *)local_48,idMap);
      std::__cxx11::string::~string((string *)&e);
    }
    equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      peVar7 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2b0);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Variable::equivalentVariableCount(peVar7);
      if (p_Var6 <= equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi) break;
      peVar7 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2b0);
      Variable::equivalentVariable
                ((Variable *)
                 &equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(size_t)peVar7);
      this_00 = (shared_ptr<libcellml::ParentedEntity_const> *)((long)&s1.field_2 + 8);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
                (this_00,(shared_ptr<libcellml::Variable> *)
                         &equivParent.
                          super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      owningComponent((libcellml *)local_3d8,(ParentedEntityConstPtr *)this_00);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
                ((shared_ptr<const_libcellml::ParentedEntity> *)((long)&s1.field_2 + 8));
      bVar4 = std::operator!=((shared_ptr<libcellml::Component> *)local_3d8,(nullptr_t)0x0);
      if (bVar4) {
        peVar7 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_2b0);
        NamedEntity::name_abi_cxx11_(&local_428,&peVar7->super_NamedEntity);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        NamedEntity::name_abi_cxx11_((string *)((long)&s2.field_2 + 8),(NamedEntity *)peVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,&local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&s2.field_2 + 8));
        std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_428);
        peVar7 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&equivParent.
                                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        NamedEntity::name_abi_cxx11_(&local_488,&peVar7->super_NamedEntity);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_3d8);
        NamedEntity::name_abi_cxx11_((string *)((long)&mappingId.field_2 + 8),(NamedEntity *)peVar5)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468,&local_488,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&mappingId.field_2 + 8));
        std::__cxx11::string::~string((string *)(mappingId.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_488);
        Variable::equivalenceMappingId_abi_cxx11_
                  ((string *)((long)&mappingDescription.field_2 + 8),(Variable *)local_2b0,
                   (VariablePtr *)
                   &equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(VariablePtr *)p_Var6);
        bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_408,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_468);
        if ((bVar4) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
          peVar7 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2b0);
          NamedEntity::name_abi_cxx11_(&local_5e8,&peVar7->super_NamedEntity);
          std::operator+(&local_5c8,"between variable \'",&local_5e8);
          std::operator+(&local_5a8,&local_5c8,"\' in component \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)component);
          NamedEntity::name_abi_cxx11_(&local_608,(NamedEntity *)peVar5);
          std::operator+(&local_588,&local_5a8,&local_608);
          std::operator+(&local_568,&local_588,"\' and variable \'");
          peVar7 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&equivParent.
                                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          NamedEntity::name_abi_cxx11_(&local_628,&peVar7->super_NamedEntity);
          std::operator+(&local_548,&local_568,&local_628);
          std::operator+(&local_528,&local_548,"\' in component \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(NamedEntity *)peVar5);
          std::operator+(&local_508,&local_528,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e8,&local_508,"\'");
          std::__cxx11::string::~string((string *)&local_508);
          std::__cxx11::string::~string
                    ((string *)
                     &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_628);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5e8);
          bVar4 = isValidXmlName((string *)((long)&mappingDescription.field_2 + 8));
          if (!bVar4) {
            Issue::IssueImpl::create();
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_658);
            Issue::IssueImpl::setReferenceRule(peVar10->mPimpl,XML_ID_ATTRIBUTE);
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_658);
            peVar11 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar10->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                      (peVar11->mPimpl,(VariablePtr *)local_2b0,
                       (VariablePtr *)
                       &equivParent.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_658);
            pIVar1 = peVar10->mPimpl;
            std::operator+(&local_6d8,"Variable equivalence ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4e8);
            std::operator+(&local_6b8,&local_6d8,
                           ", does not have a valid map_variables \'id\' attribute, \'");
            std::operator+(&local_698,&local_6b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&mappingDescription.field_2 + 8));
            std::operator+(&local_678,&local_698,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_678);
            std::__cxx11::string::~string((string *)&local_678);
            std::__cxx11::string::~string((string *)&local_698);
            std::__cxx11::string::~string((string *)&local_6b8);
            std::__cxx11::string::~string((string *)&local_6d8);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_658);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_658);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&connectionId.field_2 + 8)," - variable equivalence ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e8);
          std::__cxx11::string::operator=
                    ((string *)local_48,(string *)(connectionId.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(connectionId.field_2._M_local_buf + 8));
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)idMap;
          addIdMapItem(this,(string *)((long)&mappingDescription.field_2 + 8),(string *)local_48,
                       idMap);
          std::__cxx11::string::~string((string *)local_4e8);
        }
        Variable::equivalenceConnectionId_abi_cxx11_
                  ((string *)((long)&connection.field_2 + 8),(Variable *)local_2b0,
                   (VariablePtr *)
                   &equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(VariablePtr *)p_Var6);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        local_799 = 0;
        local_7c1 = 0;
        local_7e9 = 0;
        connectionDescription.field_2._M_local_buf[0xf] = '\0';
        NamedEntity::name_abi_cxx11_(&local_758,(NamedEntity *)peVar5);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_3d8);
        NamedEntity::name_abi_cxx11_(&local_778,(NamedEntity *)peVar5);
        bVar4 = std::operator<(&local_758,&local_778);
        if (bVar4) {
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)component);
          NamedEntity::name_abi_cxx11_(&local_798,(NamedEntity *)peVar5);
          local_799 = 1;
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          NamedEntity::name_abi_cxx11_(&local_7c0,(NamedEntity *)peVar5);
          local_7c1 = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_738,&local_798,&local_7c0);
        }
        else {
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          NamedEntity::name_abi_cxx11_(&local_7e8,(NamedEntity *)peVar5);
          local_7e9 = 1;
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)component);
          NamedEntity::name_abi_cxx11_(&local_810,(NamedEntity *)peVar5);
          connectionDescription.field_2._M_local_buf[0xf] = '\x01';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_738,&local_7e8,&local_810);
        }
        if ((connectionDescription.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_810);
        }
        if ((local_7e9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_7e8);
        }
        if ((local_7c1 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_7c0);
        }
        if ((local_799 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_798);
        }
        std::__cxx11::string::~string((string *)&local_778);
        std::__cxx11::string::~string((string *)&local_758);
        bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_408,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_468);
        if (((bVar4) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) &&
           (sVar9 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)info.field_2._8_8_,(key_type *)local_738), sVar9 == 0)) {
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)component);
          NamedEntity::name_abi_cxx11_(&local_938,(NamedEntity *)peVar5);
          std::operator+(&local_918,"between components \'",&local_938);
          std::operator+(&local_8f8,&local_918,"\' and \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          NamedEntity::name_abi_cxx11_(&local_958,(NamedEntity *)peVar5);
          std::operator+(&local_8d8,&local_8f8,&local_958);
          std::operator+(&local_8b8,&local_8d8,
                         "\' because of variable equivalence between variables \'");
          peVar7 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2b0);
          NamedEntity::name_abi_cxx11_(&local_978,&peVar7->super_NamedEntity);
          std::operator+(&local_898,&local_8b8,&local_978);
          std::operator+(&local_878,&local_898,"\' and \'");
          peVar7 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&equivParent.
                                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&peVar7->super_NamedEntity);
          std::operator+(&local_858,&local_878,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_838,&local_858,"\'");
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string
                    ((string *)
                     &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&local_878);
          std::__cxx11::string::~string((string *)&local_898);
          std::__cxx11::string::~string((string *)&local_978);
          std::__cxx11::string::~string((string *)&local_8b8);
          std::__cxx11::string::~string((string *)&local_8d8);
          std::__cxx11::string::~string((string *)&local_958);
          std::__cxx11::string::~string((string *)&local_8f8);
          std::__cxx11::string::~string((string *)&local_918);
          std::__cxx11::string::~string((string *)&local_938);
          bVar4 = isValidXmlName((string *)((long)&connection.field_2 + 8));
          if (!bVar4) {
            Issue::IssueImpl::create();
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_9a8);
            Issue::IssueImpl::setReferenceRule(peVar10->mPimpl,XML_ID_ATTRIBUTE);
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_9a8);
            peVar11 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar10->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setConnection
                      (peVar11->mPimpl,(VariablePtr *)local_2b0,
                       (VariablePtr *)
                       &equivParent.
                        super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            peVar10 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_9a8);
            pIVar1 = peVar10->mPimpl;
            std::operator+(&local_a28,"Connection ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_838);
            std::operator+(&local_a08,&local_a28,
                           ", does not have a valid connection \'id\' attribute, \'");
            std::operator+(&local_9e8,&local_a08,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&connection.field_2 + 8));
            std::operator+(&local_9c8,&local_9e8,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_9c8);
            std::__cxx11::string::~string((string *)&local_9c8);
            std::__cxx11::string::~string((string *)&local_9e8);
            std::__cxx11::string::~string((string *)&local_a08);
            std::__cxx11::string::~string((string *)&local_a28);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_9a8);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_9a8);
          }
          pVar16 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)info.field_2._8_8_,(value_type *)local_738);
          local_a38 = (_Base_ptr)pVar16.first._M_node;
          local_a30 = pVar16.second;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                         " - connection ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_838);
          std::__cxx11::string::operator=((string *)local_48,(string *)&i_1);
          std::__cxx11::string::~string((string *)&i_1);
          addIdMapItem(this,(string *)((long)&connection.field_2 + 8),(string *)local_48,idMap);
          std::__cxx11::string::~string((string *)local_838);
        }
        std::__cxx11::string::~string((string *)local_738);
        std::__cxx11::string::~string((string *)(connection.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(mappingDescription.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_468);
        std::__cxx11::string::~string((string *)local_408);
      }
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_3d8);
      std::shared_ptr<libcellml::Variable>::~shared_ptr
                ((shared_ptr<libcellml::Variable> *)
                 &equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
    }
    std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_2b0);
    item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var2._M_pi = item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::resetCount(peVar5);
    if (p_Var6 <= _Var2._M_pi) break;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    Component::reset((Component *)local_a70,(size_t)peVar5);
    pEVar12 = (Entity *)
              std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a70);
    Entity::id_abi_cxx11_(&local_a90,pEVar12);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_a90);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::to_string
                (&local_b30,
                 (unsigned_long)
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      std::operator+(&local_b10," - reset at index ",&local_b30);
      std::operator+(&local_af0,&local_b10," in component \'");
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_b50,(NamedEntity *)peVar5);
      std::operator+(&local_ad0,&local_af0,&local_b50);
      std::operator+(&local_ab0,&local_ad0,"\'");
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::__cxx11::string::~string((string *)&local_b50);
      std::__cxx11::string::~string((string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_b10);
      std::__cxx11::string::~string((string *)&local_b30);
      pEVar12 = (Entity *)
                std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a70);
      Entity::id_abi_cxx11_(&local_b70,pEVar12);
      addIdMapItem(this,&local_b70,(string *)local_48,idMap);
      std::__cxx11::string::~string((string *)&local_b70);
    }
    peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a70);
    Reset::testValueId_abi_cxx11_(&local_b90,peVar13);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_b90);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::to_string
                (&local_c30,
                 (unsigned_long)
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      std::operator+(&local_c10," - test_value in reset at index ",&local_c30);
      std::operator+(&local_bf0,&local_c10," in component \'");
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_c50,(NamedEntity *)peVar5);
      std::operator+(&local_bd0,&local_bf0,&local_c50);
      std::operator+(&local_bb0,&local_bd0,"\'");
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_bb0);
      std::__cxx11::string::~string((string *)&local_bd0);
      std::__cxx11::string::~string((string *)&local_c50);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::__cxx11::string::~string((string *)&local_c10);
      std::__cxx11::string::~string((string *)&local_c30);
      peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a70);
      Reset::testValueId_abi_cxx11_(&local_c70,peVar13);
      addIdMapItem(this,&local_c70,(string *)local_48,idMap);
      std::__cxx11::string::~string((string *)&local_c70);
    }
    std::__cxx11::to_string
              (&local_d10,
               (unsigned_long)
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    std::operator+(&local_cf0,"test_value in reset ",&local_d10);
    std::operator+(&local_cd0,&local_cf0," in component \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    NamedEntity::name_abi_cxx11_(&local_d30,(NamedEntity *)peVar5);
    std::operator+(&local_cb0,&local_cd0,&local_d30);
    std::operator+(&local_c90,&local_cb0,"\'");
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::__cxx11::string::~string((string *)&local_d30);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::__cxx11::string::~string((string *)&local_d10);
    peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a70);
    Reset::testValue_abi_cxx11_(&local_d50,peVar13);
    buildMathIdMap(this,(string *)local_48,idMap,&local_d50);
    std::__cxx11::string::~string((string *)&local_d50);
    peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a70);
    Reset::resetValueId_abi_cxx11_(&local_d70,peVar13);
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_d70);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::to_string
                (&local_e10,
                 (unsigned_long)
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      std::operator+(&local_df0," - reset_value in reset at index ",&local_e10);
      std::operator+(&local_dd0,&local_df0," in component \'");
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_e30,(NamedEntity *)peVar5);
      std::operator+(&local_db0,&local_dd0,&local_e30);
      std::operator+(&local_d90,&local_db0,"\'");
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_d90);
      std::__cxx11::string::~string((string *)&local_d90);
      std::__cxx11::string::~string((string *)&local_db0);
      std::__cxx11::string::~string((string *)&local_e30);
      std::__cxx11::string::~string((string *)&local_dd0);
      std::__cxx11::string::~string((string *)&local_df0);
      std::__cxx11::string::~string((string *)&local_e10);
      peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a70);
      Reset::resetValueId_abi_cxx11_(&local_e50,peVar13);
      addIdMapItem(this,&local_e50,(string *)local_48,idMap);
      std::__cxx11::string::~string((string *)&local_e50);
    }
    std::__cxx11::to_string
              (&local_ef0,
               (unsigned_long)
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    std::operator+(&local_ed0,"reset_value in reset ",&local_ef0);
    std::operator+(&local_eb0,&local_ed0," in component \'");
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    NamedEntity::name_abi_cxx11_(&local_f10,(NamedEntity *)peVar5);
    std::operator+(&local_e90,&local_eb0,&local_f10);
    std::operator+(&local_e70,&local_e90,"\'");
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_e70);
    std::__cxx11::string::~string((string *)&local_e70);
    std::__cxx11::string::~string((string *)&local_e90);
    std::__cxx11::string::~string((string *)&local_f10);
    std::__cxx11::string::~string((string *)&local_eb0);
    std::__cxx11::string::~string((string *)&local_ed0);
    std::__cxx11::string::~string((string *)&local_ef0);
    peVar13 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a70);
    Reset::resetValue_abi_cxx11_(&local_f30,peVar13);
    buildMathIdMap(this,(string *)local_48,idMap,&local_f30);
    std::__cxx11::string::~string((string *)&local_f30);
    std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_a70);
    item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  NamedEntity::name_abi_cxx11_(&local_f90,(NamedEntity *)peVar5);
  std::operator+(&local_f70,"math in component \'",&local_f90);
  std::operator+(&local_f50,&local_f70,"\'");
  std::__cxx11::string::operator=((string *)local_48,(string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  Component::math_abi_cxx11_(&local_fb0,peVar5);
  buildMathIdMap(this,(string *)local_48,idMap,&local_fb0);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component);
  local_ff1 = 0;
  local_ff2 = 0;
  ImportedEntity::importSource(&local_fc0);
  bVar4 = std::operator!=((shared_ptr<libcellml::ImportSource> *)&local_fc0,(nullptr_t)0x0);
  local_1369 = 0;
  if (bVar4) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)component);
    ImportedEntity::importSource(&local_ff0);
    local_ff1 = 1;
    peVar14 = std::
              __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_ff0);
    Entity::id_abi_cxx11_(&local_fe0,&peVar14->super_Entity);
    local_ff2 = 1;
    local_1369 = std::__cxx11::string::empty();
    local_1369 = local_1369 ^ 0xff;
  }
  if ((local_ff2 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_fe0);
  }
  if ((local_ff1 & 1) != 0) {
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_ff0);
  }
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&local_fc0);
  if ((local_1369 & 1) != 0) {
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    NamedEntity::name_abi_cxx11_(&local_1058,(NamedEntity *)peVar5);
    std::operator+(&local_1038," - import source for component \'",&local_1058);
    std::operator+(&local_1018,&local_1038,"\'");
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)component);
    ImportedEntity::importSource(&local_1088);
    peVar14 = std::
              __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_1088);
    Entity::id_abi_cxx11_(&local_1078,&peVar14->super_Entity);
    addIdMapItem(this,&local_1078,(string *)local_48,idMap);
    std::__cxx11::string::~string((string *)&local_1078);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_1088);
  }
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  ComponentEntity::encapsulationId_abi_cxx11_(&local_10a8,&peVar5->super_ComponentEntity);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_10a8);
  if (((bVar3 ^ 0xff) & 1) != 0) {
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::encapsulationId_abi_cxx11_
              ((string *)
               &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&peVar5->super_ComponentEntity);
    bVar4 = isValidXmlName((string *)
                           &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      Issue::IssueImpl::create();
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_10d8);
      Issue::IssueImpl::setReferenceRule(peVar10->mPimpl,XML_ID_ATTRIBUTE);
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_10d8);
      peVar11 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar10->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setComponent(peVar11->mPimpl,component,COMPONENT);
      peVar10 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_10d8);
      pIVar1 = peVar10->mPimpl;
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_1178,(NamedEntity *)peVar5);
      std::operator+(&local_1158,"Component \'",&local_1178);
      std::operator+(&local_1138,&local_1158,
                     "\' does not have a valid encapsulation \'id\' attribute, \'");
      peVar5 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      ComponentEntity::encapsulationId_abi_cxx11_(&local_1198,&peVar5->super_ComponentEntity);
      std::operator+(&local_1118,&local_1138,&local_1198);
      std::operator+(&local_10f8,&local_1118,"\'.");
      Issue::IssueImpl::setDescription(pIVar1,&local_10f8);
      std::__cxx11::string::~string((string *)&local_10f8);
      std::__cxx11::string::~string((string *)&local_1118);
      std::__cxx11::string::~string((string *)&local_1198);
      std::__cxx11::string::~string((string *)&local_1138);
      std::__cxx11::string::~string((string *)&local_1158);
      std::__cxx11::string::~string((string *)&local_1178);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_10d8);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_10d8);
    }
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    NamedEntity::name_abi_cxx11_(&local_11f8,(NamedEntity *)peVar5);
    std::operator+(&local_11d8," - encapsulation component_ref to component \'",&local_11f8);
    std::operator+(&local_11b8,&local_11d8,"\'");
    std::__cxx11::string::operator=((string *)local_48,(string *)&local_11b8);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::__cxx11::string::~string((string *)&local_11d8);
    std::__cxx11::string::~string((string *)&local_11f8);
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::encapsulationId_abi_cxx11_((string *)&c,&peVar5->super_ComponentEntity);
    addIdMapItem(this,(string *)&c,(string *)local_48,idMap);
    std::__cxx11::string::~string((string *)&c);
  }
  local_1220 = 0;
  while( true ) {
    uVar8 = local_1220;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    sVar15 = ComponentEntity::componentCount(&peVar5->super_ComponentEntity);
    if (sVar15 <= uVar8) break;
    peVar5 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::component(&local_1230,(size_t)peVar5);
    buildComponentIdMap(this,(ComponentPtr *)&local_1230,idMap,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)info.field_2._8_8_);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_1230);
    local_1220 = local_1220 + 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Validator::ValidatorImpl::buildComponentIdMap(const ComponentPtr &component, IdMap &idMap, std::set<std::string> &reportedConnections)
{
    std::string info;

    // Component.
    if (!component->id().empty()) {
        std::string imported;
        std::string owning;
        if (component->isImport()) {
            imported = "imported ";
        }
        if (owningComponent(component) != nullptr) {
            owning = "' in component '" + owningComponent(component)->name() + "'";
        } else {
            owning = "' in model '" + owningModel(component)->name() + "'";
        }
        info = " - " + imported + "component '" + component->name() + owning;
        addIdMapItem(component->id(), info, idMap);
    }

    // Variables.
    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto item = component->variable(i);
        if (!item->id().empty()) {
            info = " - variable '" + item->name() + "' in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        // Equivalent variables.
        for (size_t e = 0; e < item->equivalentVariableCount(); ++e) {
            auto equiv = item->equivalentVariable(e);
            auto equivParent = owningComponent(equiv);
            if (equivParent != nullptr) {
                // Skipping half of the equivalences to avoid duplicate reporting.
                std::string s1 = item->name() + component->name();
                std::string s2 = equiv->name() + equivParent->name();
                std::string mappingId = Variable::equivalenceMappingId(item, equiv);
                // Variable mapping.
                if ((s1 < s2) && !mappingId.empty()) {
                    std::string mappingDescription =
                        "between variable '" + item->name() + "' in component '" + component->name()
                        + "' and variable '" + equiv->name() + "' in component '" + equivParent->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(mappingId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setMapVariables(item, equiv);
                        issue->mPimpl->setDescription("Variable equivalence " + mappingDescription + ", does not have a valid map_variables 'id' attribute, '" + mappingId + "'.");
                        addIssue(issue);
                    }

                    info = " - variable equivalence " + mappingDescription;
                    addIdMapItem(mappingId, info, idMap);
                }
                // Connections.
                auto connectionId = Variable::equivalenceConnectionId(item, equiv);
                std::string connection = component->name() < equivParent->name() ? component->name() + equivParent->name() : equivParent->name() + component->name();
                if ((s1 < s2) && !connectionId.empty() && (reportedConnections.count(connection) == 0)) {
                    std::string connectionDescription =
                        "between components '" + component->name() + "' and '" + equivParent->name()
                        + "' because of variable equivalence between variables '" + item->name()
                        + "' and '" + equiv->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(connectionId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setConnection(item, equiv);
                        issue->mPimpl->setDescription("Connection " + connectionDescription + ", does not have a valid connection 'id' attribute, '" + connectionId + "'.");
                        addIssue(issue);
                    }

                    reportedConnections.insert(connection);
                    info = " - connection " + connectionDescription;
                    addIdMapItem(connectionId, info, idMap);
                }
            }
        }
    }

    // Resets.
    for (size_t i = 0; i < component->resetCount(); ++i) {
        auto item = component->reset(i);
        if (!item->id().empty()) {
            info = " - reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        if (!item->testValueId().empty()) {
            info = " - test_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->testValueId(), info, idMap);
        }
        info = "test_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->testValue());
        if (!item->resetValueId().empty()) {
            info = " - reset_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->resetValueId(), info, idMap);
        }
        info = "reset_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->resetValue());
    }

    // Maths.
    info = "math in component '" + component->name() + "'";
    buildMathIdMap(info, idMap, component->math());

    // Imports.
    if ((component->importSource() != nullptr) && !component->importSource()->id().empty()) {
        info = " - import source for component '" + component->name() + "'";
        addIdMapItem(component->importSource()->id(), info, idMap);
    }

    // Hierarchy.
    if (!component->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(component->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setDescription("Component '" + component->name() + "' does not have a valid encapsulation 'id' attribute, '" + component->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation component_ref to component '" + component->name() + "'";
        addIdMapItem(component->encapsulationId(), info, idMap);
    }

    // Child components.
    for (size_t c = 0; c < component->componentCount(); ++c) {
        buildComponentIdMap(component->component(c), idMap, reportedConnections);
    }
}